

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celf.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELF::celfalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
              CascadeModel model)

{
  _Map_pointer *this;
  pointer *ppuVar1;
  __tuple_element_t<3UL,_tuple<unsigned_long,_double,_double,_unsigned_long>_> _Var2;
  bool bVar3;
  ostream *poVar4;
  double dVar5;
  double *pdVar6;
  const_reference pvVar7;
  reference pvVar8;
  __tuple_element_t<2UL,_tuple<unsigned_long,_double,_double,_unsigned_long>_> *p_Var9;
  __tuple_element_t<3UL,_tuple<unsigned_long,_double,_double,_unsigned_long>_> *p_Var10;
  size_type sVar11;
  __tuple_element_t<0UL,_tuple<unsigned_long,_double,_double,_unsigned_long>_> *p_Var12;
  __tuple_element_t<1UL,_tuple<unsigned_long,_double,_double,_unsigned_long>_> *p_Var13;
  double dVar14;
  double dVar15;
  iterator local_360;
  iterator local_340;
  undefined1 local_320 [8];
  tuple<unsigned_long,_double,_double,_unsigned_long> u_1;
  double S_CB_inf;
  double budget_CB;
  iterator local_2e8;
  iterator local_2c8;
  undefined1 local_2a8 [8];
  tuple<unsigned_long,_double,_double,_unsigned_long> u;
  double S_UC_inf;
  double budget_UC;
  iterator local_270;
  iterator local_250;
  iterator local_228;
  iterator local_208;
  int local_1e4;
  double local_1e0;
  tuple<unsigned_long,_double,_double,_int> local_1d8;
  tuple<unsigned_long,_double,_double,_unsigned_long> local_1b8;
  int local_194;
  tuple<unsigned_long,_double,_double,_int> local_190;
  tuple<unsigned_long,_double,_double,_unsigned_long> local_170;
  double local_150;
  double mg;
  size_t i;
  clock_t endTime;
  clock_t startTime;
  undefined1 local_128 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_CB;
  undefined1 local_b0 [8];
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_UC;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_CB;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_UC;
  CascadeModel model_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::deque((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
           *)local_b0);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::deque((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
           *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&startTime + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,1,
             (allocator<unsigned_long> *)((long)&startTime + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&startTime + 7));
  endTime = clock();
  poVar4 = std::operator<<((ostream *)&std::cout,"Initial deque start");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (mg = 0.0; dVar14 = mg,
      dVar5 = (double)std::
                      vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ::size(graph), dVar15 = mg, (ulong)dVar14 < (ulong)dVar5;
      mg = (double)((long)mg + 1)) {
    pdVar6 = (double *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,0);
    *pdVar6 = dVar15;
    local_150 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_128,model,10000);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(size_type)mg);
    local_194 = 0;
    std::make_tuple<unsigned_long&,double&,double_const&,int>
              (&local_190,(unsigned_long *)&mg,&local_150,pvVar7,&local_194);
    std::tuple<unsigned_long,_double,_double,_unsigned_long>::
    tuple<unsigned_long,_double,_double,_int,_true,_true>(&local_170,&local_190);
    std::
    deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
    ::push_back((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                 *)local_b0,&local_170);
    dVar14 = local_150;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(size_type)mg);
    local_1e0 = dVar14 / *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(size_type)mg);
    local_1e4 = 0;
    std::make_tuple<unsigned_long&,double,double_const&,int>
              (&local_1d8,(unsigned_long *)&mg,&local_1e0,pvVar7,&local_1e4);
    std::tuple<unsigned_long,_double,_double,_unsigned_long>::
    tuple<unsigned_long,_double,_double,_int,_true,_true>(&local_1b8,&local_1d8);
    std::
    deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
    ::push_back((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                 *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b8);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Initial deque end");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  i = clock();
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(double)((long)(i - endTime) / 1000000));
  poVar4 = std::operator<<(poVar4," s");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::begin(&local_208,
          (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
           *)local_b0);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::end(&local_228,
        (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
         *)local_b0);
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>
            (&local_208,&local_228);
  ppuVar1 = &vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::begin(&local_250,
          (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
           *)ppuVar1);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::end(&local_270,
        (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
         *)ppuVar1);
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>
            (&local_250,&local_270);
  poVar4 = std::operator<<((ostream *)&std::cout,"Start UC");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  S_UC_inf = 0.0;
  u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  while (S_UC_inf < budget) {
    do {
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)local_b0);
      p_Var9 = std::get<2ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      if (*p_Var9 + S_UC_inf <= budget) break;
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                   *)local_b0);
      bVar3 = std::
              deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ::empty((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                       *)local_b0);
    } while (!bVar3);
    bVar3 = std::
            deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
            ::empty((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                     *)local_b0);
    if (bVar3) break;
    pvVar8 = std::
             deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      *)local_b0);
    local_2a8 = (undefined1  [8])
                (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
                super__Head_base<3UL,_unsigned_long,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
         super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
         super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
         _M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
           super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)(pvVar8->
                           super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    p_Var10 = std::get<3ul,unsigned_long,double,double,unsigned_long>
                        ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_2a8);
    _Var2 = *p_Var10;
    sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (_Var2 == sVar11) {
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_2a8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,p_Var12);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                   *)local_b0);
      p_Var9 = std::get<2ul,unsigned_long,double,double,unsigned_long>
                         ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_2a8);
      S_UC_inf = S_UC_inf + *p_Var9;
      u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (unsigned_long)
           GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &S_CB.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,model,10000
                              );
      poVar4 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_2a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*p_Var12);
      poVar4 = std::operator<<(poVar4," ");
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar11);
      poVar4 = std::operator<<(poVar4," ");
      dVar14 = sum_budget(budget_list,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar14);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(double)u.
                                         super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_2a8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,p_Var12);
      dVar14 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         &S_CB.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,model,
                                   10000);
      dVar14 = dVar14 - (double)u.
                                super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)local_b0);
      p_Var13 = std::get<1ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      *p_Var13 = dVar14;
      ppuVar1 = &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1);
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1);
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)local_b0);
      p_Var10 = std::get<3ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      *p_Var10 = sVar11;
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::begin(&local_2c8,
              (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               *)local_b0);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::end(&local_2e8,
            (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             *)local_b0);
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>
                (&local_2c8,&local_2e8);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"End UC");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Start CB");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  S_CB_inf = 0.0;
  u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  while (S_CB_inf < budget) {
    do {
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var9 = std::get<2ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      if (*p_Var9 + S_CB_inf <= budget) break;
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                   *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::
              deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ::empty((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                       *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    } while (!bVar3);
    bVar3 = std::
            deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
            ::empty((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                     *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) break;
    pvVar8 = std::
             deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_320 = (undefined1  [8])
                (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
                super__Head_base<3UL,_unsigned_long,_false>._M_head_impl;
    u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
         super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
         super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
         _M_head_impl;
    u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
           super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
    u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)(pvVar8->
                           super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    p_Var10 = std::get<3ul,unsigned_long,double,double,unsigned_long>
                        ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
    _Var2 = *p_Var10;
    sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &Q_UC.
                         super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (_Var2 == sVar11) {
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,p_Var12);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                   *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var9 = std::get<2ul,unsigned_long,double,double,unsigned_long>
                         ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
      S_CB_inf = S_CB_inf + *p_Var9;
      u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (unsigned_long)
           GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &Q_UC.
                                      super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node,model,10000)
      ;
      poVar4 = std::operator<<((ostream *)&std::cout,"CB push new seed: ");
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*p_Var12);
      poVar4 = std::operator<<(poVar4," ");
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &Q_UC.
                           super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar11);
      poVar4 = std::operator<<(poVar4," ");
      dVar14 = sum_budget(budget_list,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &Q_UC.
                           super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar14);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(double)u_1.
                                         super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      p_Var12 = std::get<0ul,unsigned_long,double,double,unsigned_long>
                          ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,p_Var12);
      dVar15 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         &Q_UC.
                                          super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_node,model,
                                   10000);
      dVar15 = dVar15 - (double)u_1.
                                super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      p_Var9 = std::get<2ul,unsigned_long,double,double,unsigned_long>
                         ((tuple<unsigned_long,_double,_double,_unsigned_long> *)local_320);
      dVar14 = *p_Var9;
      ppuVar1 = &vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)ppuVar1);
      p_Var13 = std::get<1ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      *p_Var13 = dVar15 / dVar14;
      this = &Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      pvVar8 = std::
               deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               ::front((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        *)ppuVar1);
      p_Var10 = std::get<3ul,unsigned_long,double,double,unsigned_long>(pvVar8);
      *p_Var10 = sVar11;
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::begin(&local_340,
              (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               *)ppuVar1);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::end(&local_360,
            (deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             *)ppuVar1);
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>
                (&local_340,&local_360);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"CB end");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if ((double)u_1.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl <=
      (double)u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl) {
    poVar4 = std::operator<<((ostream *)&std::cout,"UC_inf: ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(double)u.
                                       super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"CB_inf: ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,(double)u_1.
                                       super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>
                                       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &Q_UC.
                super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~deque((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
            *)&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~deque((deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
            *)local_b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> celfalgo(const Graph& graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        std::deque<std::tuple<size_t, double, double, size_t>> Q_UC;  // u u.mg u.cost u.iter
        std::deque<std::tuple<size_t, double, double, size_t>> Q_CB;  // u u.mg/u.cost u.cost u.iter

        std::vector<size_t> vecSeed(1);

        clock_t startTime, endTime;
        startTime = clock();
        std::cout << "Initial deque start" << std::endl;
        for (size_t i = 0; i < graph.size(); i++){
            vecSeed[0] = i;
            double mg = GraphBase::inf_eval(graph, vecSeed, model);
            Q_UC.push_back(std::make_tuple(i, mg, budget_list[i], 0));
            Q_CB.push_back(std::make_tuple(i, mg / budget_list[i], budget_list[i], 0));
        }
        std::cout << "Initial deque end" << std::endl;
        endTime = clock();
        std::cout << double((endTime - startTime) / CLOCKS_PER_SEC) << " s" << std::endl;

        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::cout << "Start UC" << std::endl;
        double budget_UC = 0;
        double S_UC_inf = 0;
        while(budget_UC < budget) {
            while(std::get<2>(Q_UC.front()) + budget_UC > budget){  // u u.mg u.cost u.iter
                Q_UC.pop_front();
                if(Q_UC.empty()){
                    break;
                }
            }
            if(Q_UC.empty()){
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_UC.front();  // u u.mg u.cost u.iter
            if(std::get<3>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<2>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<3>(Q_UC.front()) = S_UC.size();
                std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "End UC" << std::endl;

        std::cout << "Start CB" << std::endl;
        double budget_CB = 0;
        double S_CB_inf = 0;
        while(budget_CB < budget) {
            while(std::get<2>(Q_CB.front()) + budget_CB > budget){
                Q_CB.pop_front();
                if(Q_CB.empty()){
                    break;
                }
            }
            if(Q_CB.empty()) {
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_CB.front();  // u u.mg/u.cost u.cost u.iter
            if(std::get<3>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<2>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                std::cout << "CB push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<2>(u);
                S_CB.pop_back();
                std::get<3>(Q_CB.front()) = S_CB.size();
                std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "CB end" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }